

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O1

void __thiscall BoardView::CenterView(BoardView *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ImVec2 IVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  IVar4 = this->m_board_surface;
  uVar1 = this->m_boardWidth;
  uVar5 = this->m_boardHeight;
  uVar8 = -(uint)(0.0 < (float)(int)uVar1 * 1.1);
  uVar9 = -(uint)(0.0 < (float)(int)uVar5 * 1.1);
  auVar12._8_8_ = 0;
  auVar12._0_4_ = IVar4.x;
  auVar12._4_4_ = IVar4.y;
  auVar13._4_4_ = (float)(int)uVar5 * 1.1;
  auVar13._0_4_ = (float)(int)uVar1 * 1.1;
  auVar13._8_8_ = 0;
  auVar13 = divps(auVar12,auVar13);
  fVar10 = (float)(~uVar8 & 0x3f800000 | auVar13._0_4_ & uVar8);
  fVar11 = (float)(~uVar9 & 0x3f800000 | auVar13._4_4_ & uVar9);
  if (fVar11 <= fVar10) {
    fVar10 = fVar11;
  }
  this->m_scale = fVar10;
  this->m_scale_floor = fVar10;
  IVar4 = ScreenToCoord(this,IVar4.x * 0.5,IVar4.y * 0.5,1.0);
  uVar2 = this->m_dx;
  uVar6 = this->m_dy;
  uVar3 = this->m_mx;
  uVar7 = this->m_my;
  this->m_dx = (IVar4.x - (float)uVar3) + (float)uVar2;
  this->m_dy = (IVar4.y - (float)uVar7) + (float)uVar6;
  this->m_needsRedraw = true;
  return;
}

Assistant:

void BoardView::CenterView(void) {
	// ImVec2 view = ImGui::GetIO().DisplaySize;
	ImVec2 view = m_board_surface;

	float dx = 1.1f * (m_boardWidth);
	float dy = 1.1f * (m_boardHeight);
	float sx = dx > 0 ? view.x / dx : 1.0f;
	float sy = dy > 0 ? view.y / dy : 1.0f;

	//  m_rotation = 0;
	m_scale_floor = m_scale = sx < sy ? sx : sy;
	SetTarget(m_mx, m_my);
	m_needsRedraw = true;
}